

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv_udp_getsockname(uv_udp_t *handle,sockaddr *name,int *namelen)

{
  int iVar1;
  int *piVar2;
  socklen_t socklen;
  socklen_t local_c;
  
  iVar1 = (handle->io_watcher).fd;
  if (iVar1 != -1) {
    local_c = *namelen;
    iVar1 = getsockname(iVar1,(sockaddr *)name,&local_c);
    if (iVar1 == 0) {
      *namelen = local_c;
      iVar1 = 0;
    }
    else {
      piVar2 = __errno_location();
      iVar1 = -*piVar2;
    }
    return iVar1;
  }
  return -0x16;
}

Assistant:

int uv_udp_getsockname(const uv_udp_t* handle,
                       struct sockaddr* name,
                       int* namelen) {
  socklen_t socklen;

  if (handle->io_watcher.fd == -1)
    return -EINVAL;  /* FIXME(bnoordhuis) -EBADF */

  /* sizeof(socklen_t) != sizeof(int) on some systems. */
  socklen = (socklen_t) *namelen;

  if (getsockname(handle->io_watcher.fd, name, &socklen))
    return -errno;

  *namelen = (int) socklen;
  return 0;
}